

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O0

void __thiscall uWS::TopicTree::trimTree(TopicTree *this,Topic *topic)

{
  size_type sVar1;
  size_type sVar2;
  TopicTree *in_RSI;
  long in_RDI;
  int i_1;
  int i;
  int length;
  Topic *tmp [64];
  Topic *parent;
  key_type *in_stack_fffffffffffffda8;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>_>
  *in_stack_fffffffffffffdb0;
  Topic *this_00;
  int local_234;
  int local_230;
  int local_22c;
  undefined8 auStack_228 [64];
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Topic *topic_00;
  TopicTree *this_01;
  
  sVar1 = std::
          set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>::
          size((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                *)0x24be18);
  if ((((sVar1 == 0) &&
       (sVar2 = std::
                map<std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>_>
                ::size((map<std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>_>
                        *)0x24be33), sVar2 == 0)) && (in_RSI->triggeredTopics[5] == (Topic *)0x0))
     && (in_RSI->triggeredTopics[4] == (Topic *)0x0)) {
    topic_00 = (Topic *)(in_RSI->cb).super__Function_base._M_manager;
    if (*(long *)((long)&(in_RSI->cb).super__Function_base._M_functor + 8) == 1) {
      if (**(char **)&(in_RSI->cb).super__Function_base._M_functor == '#') {
        topic_00->terminatingWildcardChild = (Topic *)0x0;
      }
      else if (**(char **)&(in_RSI->cb).super__Function_base._M_functor == '+') {
        topic_00->wildcardChild = (Topic *)0x0;
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,*(char **)&(in_RSI->cb).super__Function_base._M_functor,
               *(size_type *)((long)&(in_RSI->cb).super__Function_base._M_functor + 8));
    std::
    map<std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>_>
    ::erase(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (((ulong)(in_RSI->cb)._M_invoker & 1) != 0) {
      local_22c = 0;
      for (local_230 = 0; local_230 < *(int *)(in_RDI + 0x230); local_230 = local_230 + 1) {
        if (*(TopicTree **)(in_RDI + 0x30 + (long)local_230 * 8) != in_RSI) {
          auStack_228[local_22c] = *(undefined8 *)(in_RDI + 0x30 + (long)local_230 * 8);
          local_22c = local_22c + 1;
        }
      }
      for (local_234 = 0; local_234 < local_22c; local_234 = local_234 + 1) {
        *(undefined8 *)(in_RDI + 0x30 + (long)local_234 * 8) = auStack_228[local_234];
      }
      *(int *)(in_RDI + 0x230) = local_22c;
    }
    this_00 = *(Topic **)&(in_RSI->cb).super__Function_base._M_functor;
    if (this_00 != (Topic *)0x0) {
      operator_delete__(this_00);
    }
    this_01 = in_RSI;
    if (in_RSI != (TopicTree *)0x0) {
      Topic::~Topic(this_00);
      operator_delete(in_RSI,0xc0);
    }
    if (topic_00 != *(Topic **)(in_RDI + 0x20)) {
      trimTree(this_01,topic_00);
    }
  }
  return;
}

Assistant:

void trimTree(Topic *topic) {
        if (!topic->subs.size() && !topic->children.size() && !topic->terminatingWildcardChild && !topic->wildcardChild) {
            Topic *parent = topic->parent;

            if (topic->length == 1) {
                if (topic->name[0] == '#') {
                    parent->terminatingWildcardChild = nullptr;
                } else if (topic->name[0] == '+') {
                    parent->wildcardChild = nullptr;
                }
            }
            /* Erase us from our parents set (wildcards also live here) */
            parent->children.erase(std::string_view(topic->name, topic->length));

            /* If this node is triggered, make sure to remove it from the triggered list */
            if (topic->triggered) {
                Topic *tmp[64];
                int length = 0;
                for (int i = 0; i < numTriggeredTopics; i++) {
                    if (triggeredTopics[i] != topic) {
                        tmp[length++] = triggeredTopics[i];
                    }
                }

                for (int i = 0; i < length; i++) {
                    triggeredTopics[i] = tmp[i];
                }
                numTriggeredTopics = length;
            }

            /* Free various memory for the node */
            delete [] topic->name;
            delete topic;

            if (parent != root) {
                trimTree(parent);
            }
        }
    }